

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc_kernel_test.cxx
# Opt level: O1

void compare_libxc_builtin(TestInterface interface,EvalType evaltype,Kernel kern,Spin polar)

{
  _Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false> _Var1;
  Kernel kern_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer pcVar7;
  long lVar8;
  ulong uVar9;
  size_type sVar10;
  size_type __n;
  size_type __n_00;
  pointer pcVar11;
  long lVar12;
  size_type __n_01;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  XCKernel func_libxc;
  XCKernel func_builtin;
  double lhs_v;
  AssertionHandler catchAssertionHandler;
  vector<double,_std::allocator<double>_> rho_use;
  vector<double,_std::allocator<double>_> sigma_use;
  vector<double,_std::allocator<double>_> tau_use;
  vector<double,_std::allocator<double>_> lapl_use;
  vector<double,_std::allocator<double>_> exc_builtin;
  vector<double,_std::allocator<double>_> exc_libxc;
  vector<double,_std::allocator<double>_> vrho_builtin;
  vector<double,_std::allocator<double>_> vrho_libxc;
  vector<double,_std::allocator<double>_> ref_tau;
  vector<double,_std::allocator<double>_> ref_lapl;
  vector<double,_std::allocator<double>_> ref_sigma;
  vector<double,_std::allocator<double>_> ref_rho;
  vector<double,_std::allocator<double>_> vsigma_builtin;
  vector<double,_std::allocator<double>_> vsigma_libxc;
  ScopedMessage scopedMessage62;
  vector<double,_std::allocator<double>_> vtau_builtin;
  vector<double,_std::allocator<double>_> vlapl_builtin;
  vector<double,_std::allocator<double>_> vtau_libxc;
  vector<double,_std::allocator<double>_> vlapl_libxc;
  vector<double,_std::allocator<double>_> tau_zero;
  vector<double,_std::allocator<double>_> lapl_zero;
  vector<double,_std::allocator<double>_> sigma_zero;
  vector<double,_std::allocator<double>_> rho_zero;
  vector<double,_std::allocator<double>_> tau_small;
  vector<double,_std::allocator<double>_> lapl_small;
  vector<double,_std::allocator<double>_> sigma_small;
  vector<double,_std::allocator<double>_> rho_small;
  _Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false> local_3f8;
  _Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false> local_3f0;
  Kernel local_3e4;
  pointer local_3e0;
  double local_3d8;
  MessageBuilder local_3d0;
  vector<double,_std::allocator<double>_> local_378;
  pointer local_360;
  ITransientExpression local_358;
  double local_348;
  char *local_340;
  undefined8 local_338;
  Approx *local_330;
  vector<double,_std::allocator<double>_> local_328;
  vector<double,_std::allocator<double>_> local_308;
  vector<double,_std::allocator<double>_> local_2e8;
  vector<double,_std::allocator<double>_> local_2c8;
  vector<double,_std::allocator<double>_> local_2b0;
  vector<double,_std::allocator<double>_> local_298;
  vector<double,_std::allocator<double>_> local_280;
  vector<double,_std::allocator<double>_> local_268;
  vector<double,_std::allocator<double>_> local_248;
  vector<double,_std::allocator<double>_> local_228;
  vector<double,_std::allocator<double>_> local_208;
  vector<double,_std::allocator<double>_> local_1f0;
  vector<double,_std::allocator<double>_> local_1d8;
  undefined1 local_1c0 [8];
  undefined8 local_1b8;
  _Alloc_hider local_1b0;
  char *local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [3];
  vector<double,_std::allocator<double>_> local_170;
  vector<double,_std::allocator<double>_> local_158;
  vector<double,_std::allocator<double>_> local_140;
  vector<double,_std::allocator<double>_> local_128;
  vector<double,_std::allocator<double>_> local_110;
  vector<double,_std::allocator<double>_> local_f8;
  vector<double,_std::allocator<double>_> local_e0;
  vector<double,_std::allocator<double>_> local_c8;
  vector<double,_std::allocator<double>_> local_b0;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_80;
  vector<double,_std::allocator<double>_> local_68;
  Approx local_50;
  
  local_360 = (pointer)CONCAT44(local_360._4_4_,interface);
  local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3e4 = kern;
  load_reference_density
            ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)&local_3d0,polar);
  pcVar11 = (pointer)(long)(int)local_3d0.super_MessageStream.m_stream.m_index;
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&local_208,&local_3d0.super_MessageStream.m_stream.m_oss);
  if (local_3d0.super_MessageStream.m_stream.m_oss != (ostream *)0x0) {
    operator_delete(local_3d0.super_MessageStream.m_stream.m_oss,
                    local_3d0.m_info.macroName.m_size -
                    (long)local_3d0.super_MessageStream.m_stream.m_oss);
  }
  local_3e0 = pcVar11;
  load_reference_sigma((pair<int,_std::vector<double,_std::allocator<double>_>_> *)&local_3d0,polar)
  ;
  iVar6 = (int)local_3d0.super_MessageStream.m_stream.m_index;
  lVar8 = (long)(int)local_3d0.super_MessageStream.m_stream.m_index;
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&local_228,&local_3d0.super_MessageStream.m_stream.m_oss);
  if (local_3d0.super_MessageStream.m_stream.m_oss != (ostream *)0x0) {
    operator_delete(local_3d0.super_MessageStream.m_stream.m_oss,
                    local_3d0.m_info.macroName.m_size -
                    (long)local_3d0.super_MessageStream.m_stream.m_oss);
  }
  load_reference_lapl((pair<int,_std::vector<double,_std::allocator<double>_>_> *)&local_3d0,polar);
  iVar3 = (int)local_3d0.super_MessageStream.m_stream.m_index;
  lVar12 = (long)(int)local_3d0.super_MessageStream.m_stream.m_index;
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&local_248,&local_3d0.super_MessageStream.m_stream.m_oss);
  if (local_3d0.super_MessageStream.m_stream.m_oss != (ostream *)0x0) {
    operator_delete(local_3d0.super_MessageStream.m_stream.m_oss,
                    local_3d0.m_info.macroName.m_size -
                    (long)local_3d0.super_MessageStream.m_stream.m_oss);
  }
  load_reference_tau((pair<int,_std::vector<double,_std::allocator<double>_>_> *)&local_3d0,polar);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&local_268,&local_3d0.super_MessageStream.m_stream.m_oss);
  if (local_3d0.super_MessageStream.m_stream.m_oss != (ostream *)0x0) {
    operator_delete(local_3d0.super_MessageStream.m_stream.m_oss,
                    local_3d0.m_info.macroName.m_size -
                    (long)local_3d0.super_MessageStream.m_stream.m_oss);
  }
  local_1c0 = (undefined1  [8])0x103d1b0;
  local_1b8 = 0x2ff;
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  capturedExpression.m_size = 0x14;
  capturedExpression.m_start = "npts_lda == npts_gga";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_3d0,macroName,(SourceLineInfo *)local_1c0,capturedExpression
             ,Normal);
  local_1b8._0_2_ = CONCAT11((int)local_3e0 == iVar6,true);
  local_1c0 = (undefined1  [8])&PTR_streamReconstructedExpression_01114770;
  local_1b0._M_p = local_3e0;
  local_1a8 = "==";
  local_1a0[0]._M_allocated_capacity = 2;
  local_1a0[0]._8_8_ = lVar8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&local_3d0,(ITransientExpression *)local_1c0);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_3d0);
  pcVar11 = local_3e0;
  if (local_3d0.m_info.message.field_2._M_local_buf[0xb] == '\0') {
    (**(code **)(*(long *)local_3d0.m_info.lineInfo.file + 0xa0))();
  }
  local_1c0 = (undefined1  [8])0x103d1b0;
  local_1b8 = 0x300;
  macroName_00.m_size = 7;
  macroName_00.m_start = "REQUIRE";
  capturedExpression_00.m_size = 0x15;
  capturedExpression_00.m_start = "npts_lda == npts_mgga";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_3d0,macroName_00,(SourceLineInfo *)local_1c0,
             capturedExpression_00,Normal);
  iVar6 = (int)pcVar11;
  local_1b8._0_2_ = CONCAT11(iVar6 == (int)local_3d0.super_MessageStream.m_stream.m_index,true);
  local_1c0 = (undefined1  [8])&PTR_streamReconstructedExpression_01114770;
  local_1b0._M_p = pcVar11;
  local_1a8 = "==";
  local_1a0[0]._M_allocated_capacity = 2;
  local_1a0[0]._8_8_ = (long)(int)local_3d0.super_MessageStream.m_stream.m_index;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&local_3d0,(ITransientExpression *)local_1c0);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_3d0);
  if (local_3d0.m_info.message.field_2._M_local_buf[0xb] == '\0') {
    (**(code **)(*(long *)local_3d0.m_info.lineInfo.file + 0xa0))();
  }
  local_1c0 = (undefined1  [8])0x103d1b0;
  local_1b8 = 0x301;
  macroName_01.m_size = 7;
  macroName_01.m_start = "REQUIRE";
  capturedExpression_01.m_size = 0x15;
  capturedExpression_01.m_start = "npts_lda == npts_lapl";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_3d0,macroName_01,(SourceLineInfo *)local_1c0,
             capturedExpression_01,Normal);
  local_1b8._0_2_ = CONCAT11(iVar6 == iVar3,true);
  local_1c0 = (undefined1  [8])&PTR_streamReconstructedExpression_01114770;
  local_1b0._M_p = pcVar11;
  local_1a8 = "==";
  local_1a0[0]._M_allocated_capacity = 2;
  local_1a0[0]._8_8_ = lVar12;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&local_3d0,(ITransientExpression *)local_1c0);
  kern_00 = local_3e4;
  Catch::AssertionHandler::complete((AssertionHandler *)&local_3d0);
  if (local_3d0.m_info.message.field_2._M_local_buf[0xb] == '\0') {
    (**(code **)(*(long *)local_3d0.m_info.lineInfo.file + 0xa0))();
  }
  ExchCXX::XCKernel::XCKernel((XCKernel *)&local_3f8,libxc,kern_00,polar);
  ExchCXX::XCKernel::XCKernel((XCKernel *)&local_3f0,builtin,kern_00,polar);
  iVar3 = (*(local_3f8._M_head_impl)->_vptr_XCKernelImpl[7])();
  _Var1._M_head_impl = local_3f8._M_head_impl;
  iVar4 = (*(local_3f8._M_head_impl)->_vptr_XCKernelImpl[3])(local_3f8._M_head_impl);
  if ((char)iVar4 == '\0') {
    iVar5 = (*(_Var1._M_head_impl)->_vptr_XCKernelImpl[7])(_Var1._M_head_impl);
    iVar4 = iVar6 * 3;
    if ((char)iVar5 == '\0') {
      iVar4 = iVar6;
    }
    sVar10 = (size_type)iVar4;
  }
  else {
    sVar10 = 0;
  }
  _Var1._M_head_impl = local_3f8._M_head_impl;
  iVar6 = (*(local_3f8._M_head_impl)->_vptr_XCKernelImpl[9])(local_3f8._M_head_impl);
  if ((char)iVar6 == '\0') {
    __n_01 = 0;
  }
  else {
    iVar6 = (*(_Var1._M_head_impl)->_vptr_XCKernelImpl[7])(_Var1._M_head_impl);
    __n_01 = (size_type)(int)((long)pcVar11 << ((byte)iVar6 & 0x3f));
  }
  _Var1._M_head_impl = local_3f8._M_head_impl;
  iVar6 = (*(local_3f8._M_head_impl)->_vptr_XCKernelImpl[5])(local_3f8._M_head_impl);
  if ((char)iVar6 == '\0') {
    __n = 0;
  }
  else {
    iVar6 = (*(_Var1._M_head_impl)->_vptr_XCKernelImpl[7])(_Var1._M_head_impl);
    __n = (size_type)(int)((long)pcVar11 << ((byte)iVar6 & 0x3f));
  }
  __n_00 = (size_type)(int)((long)pcVar11 << ((byte)iVar3 & 0x3f));
  local_3d0.super_MessageStream.m_stream.m_index = 0x3d3c25c268497682;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_68,__n_00,(value_type_conflict1 *)&local_3d0,(allocator_type *)local_1c0);
  local_3d0.super_MessageStream.m_stream.m_index = 0x3d06849b86a12b9b;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_80,sVar10,(value_type_conflict1 *)&local_3d0,(allocator_type *)local_1c0);
  local_3d0.super_MessageStream.m_stream.m_index = 0x3d06849b86a12b9b;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_98,__n_01,(value_type_conflict1 *)&local_3d0,(allocator_type *)local_1c0);
  local_3d0.super_MessageStream.m_stream.m_index = 0x3d06849b86a12b9b;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_b0,__n,(value_type_conflict1 *)&local_3d0,(allocator_type *)local_1c0);
  local_3d0.super_MessageStream.m_stream.m_index = 0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_c8,__n_00,(value_type_conflict1 *)&local_3d0,(allocator_type *)local_1c0);
  pcVar11 = local_3e0;
  local_3d0.super_MessageStream.m_stream.m_index = 0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_e0,sVar10,(value_type_conflict1 *)&local_3d0,(allocator_type *)local_1c0);
  local_3d0.super_MessageStream.m_stream.m_index = 0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_f8,__n_01,(value_type_conflict1 *)&local_3d0,(allocator_type *)local_1c0);
  local_3d0.super_MessageStream.m_stream.m_index = 0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_110,__n,(value_type_conflict1 *)&local_3d0,(allocator_type *)local_1c0);
  local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (evaltype == Zero) {
    local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::operator=(&local_378,&local_c8);
    std::vector<double,_std::allocator<double>_>::operator=(&local_328,&local_e0);
    std::vector<double,_std::allocator<double>_>::operator=(&local_2e8,&local_f8);
    std::vector<double,_std::allocator<double>_>::operator=(&local_308,&local_110);
  }
  else if (evaltype == Small) {
    local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::operator=(&local_378,&local_68);
    std::vector<double,_std::allocator<double>_>::operator=(&local_328,&local_80);
    std::vector<double,_std::allocator<double>_>::operator=(&local_2e8,&local_98);
    std::vector<double,_std::allocator<double>_>::operator=(&local_308,&local_b0);
  }
  else if (evaltype == Regular) {
    std::vector<double,_std::allocator<double>_>::operator=(&local_378,&local_208);
    std::vector<double,_std::allocator<double>_>::operator=(&local_328,&local_228);
    std::vector<double,_std::allocator<double>_>::operator=(&local_2e8,&local_248);
    std::vector<double,_std::allocator<double>_>::operator=(&local_308,&local_268);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_2b0,(size_type)pcVar11,(allocator_type *)&local_3d0);
  iVar6 = (*(local_3f0._M_head_impl)->_vptr_XCKernelImpl[7])();
  std::vector<double,_std::allocator<double>_>::vector
            (&local_280,(long)pcVar11 << ((byte)iVar6 & 0x3f),(allocator_type *)&local_3d0);
  _Var1._M_head_impl = local_3f0._M_head_impl;
  iVar6 = (*(local_3f0._M_head_impl)->_vptr_XCKernelImpl[3])(local_3f0._M_head_impl);
  if ((char)iVar6 == '\0') {
    iVar6 = (*(_Var1._M_head_impl)->_vptr_XCKernelImpl[7])(_Var1._M_head_impl);
    pcVar7 = (pointer)((long)pcVar11 * 3);
    if ((char)iVar6 == '\0') {
      pcVar7 = pcVar11;
    }
  }
  else {
    pcVar7 = (pointer)0x0;
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_1d8,(size_type)pcVar7,(allocator_type *)&local_3d0);
  _Var1._M_head_impl = local_3f0._M_head_impl;
  iVar6 = (*(local_3f0._M_head_impl)->_vptr_XCKernelImpl[9])(local_3f0._M_head_impl);
  if ((char)iVar6 == '\0') {
    sVar10 = 0;
  }
  else {
    iVar6 = (*(_Var1._M_head_impl)->_vptr_XCKernelImpl[7])(_Var1._M_head_impl);
    sVar10 = (long)pcVar11 << ((byte)iVar6 & 0x3f);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_128,sVar10,(allocator_type *)&local_3d0);
  _Var1._M_head_impl = local_3f0._M_head_impl;
  iVar6 = (*(local_3f0._M_head_impl)->_vptr_XCKernelImpl[5])(local_3f0._M_head_impl);
  if ((char)iVar6 == '\0') {
    sVar10 = 0;
  }
  else {
    iVar6 = (*(_Var1._M_head_impl)->_vptr_XCKernelImpl[7])(_Var1._M_head_impl);
    sVar10 = (long)pcVar11 << ((byte)iVar6 & 0x3f);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_140,sVar10,(allocator_type *)&local_3d0);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_2c8,(size_type)pcVar11,(allocator_type *)&local_3d0);
  iVar6 = (*(local_3f0._M_head_impl)->_vptr_XCKernelImpl[7])();
  std::vector<double,_std::allocator<double>_>::vector
            (&local_298,(long)pcVar11 << ((byte)iVar6 & 0x3f),(allocator_type *)&local_3d0);
  _Var1._M_head_impl = local_3f0._M_head_impl;
  iVar6 = (*(local_3f0._M_head_impl)->_vptr_XCKernelImpl[3])(local_3f0._M_head_impl);
  if ((char)iVar6 == '\0') {
    iVar6 = (*(_Var1._M_head_impl)->_vptr_XCKernelImpl[7])(_Var1._M_head_impl);
    pcVar7 = (pointer)((long)pcVar11 * 3);
    if ((char)iVar6 == '\0') {
      pcVar7 = pcVar11;
    }
  }
  else {
    pcVar7 = (pointer)0x0;
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_1f0,(size_type)pcVar7,(allocator_type *)&local_3d0);
  _Var1._M_head_impl = local_3f0._M_head_impl;
  iVar6 = (*(local_3f0._M_head_impl)->_vptr_XCKernelImpl[9])(local_3f0._M_head_impl);
  if ((char)iVar6 == '\0') {
    sVar10 = 0;
  }
  else {
    iVar6 = (*(_Var1._M_head_impl)->_vptr_XCKernelImpl[7])(_Var1._M_head_impl);
    sVar10 = (long)pcVar11 << ((byte)iVar6 & 0x3f);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_158,sVar10,(allocator_type *)&local_3d0);
  _Var1._M_head_impl = local_3f0._M_head_impl;
  iVar6 = (*(local_3f0._M_head_impl)->_vptr_XCKernelImpl[5])(local_3f0._M_head_impl);
  if ((char)iVar6 == '\0') {
    sVar10 = 0;
  }
  else {
    iVar6 = (*(_Var1._M_head_impl)->_vptr_XCKernelImpl[7])(_Var1._M_head_impl);
    sVar10 = (long)pcVar11 << ((byte)iVar6 & 0x3f);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_170,sVar10,(allocator_type *)&local_3d0);
  iVar6 = (*(local_3f8._M_head_impl)->_vptr_XCKernelImpl[3])();
  if ((char)iVar6 == '\0') {
    iVar6 = (*(local_3f8._M_head_impl)->_vptr_XCKernelImpl[4])();
    if ((char)iVar6 == '\0') {
      iVar6 = (*(local_3f8._M_head_impl)->_vptr_XCKernelImpl[5])();
      if ((char)iVar6 != '\0') {
        if ((int)local_360 == 1) {
          (*(local_3f8._M_head_impl)->_vptr_XCKernelImpl[0x16])
                    (local_3f8._M_head_impl,(ulong)pcVar11 & 0xffffffff,
                     local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
          (*(local_3f0._M_head_impl)->_vptr_XCKernelImpl[0x16])
                    (local_3f0._M_head_impl,(ulong)pcVar11 & 0xffffffff,
                     local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
        }
        else if ((int)local_360 == 0) {
          (*(local_3f8._M_head_impl)->_vptr_XCKernelImpl[0x15])
                    (local_3f8._M_head_impl,(ulong)pcVar11 & 0xffffffff,
                     local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
          (*(local_3f0._M_head_impl)->_vptr_XCKernelImpl[0x15])
                    (local_3f0._M_head_impl,(ulong)pcVar11 & 0xffffffff,
                     local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
        }
      }
    }
    else if ((int)local_360 == 1) {
      (*(local_3f8._M_head_impl)->_vptr_XCKernelImpl[0x12])
                (local_3f8._M_head_impl,(ulong)pcVar11 & 0xffffffff,
                 local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (*(local_3f0._M_head_impl)->_vptr_XCKernelImpl[0x12])
                (local_3f0._M_head_impl,(ulong)pcVar11 & 0xffffffff,
                 local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
    else if ((int)local_360 == 0) {
      (*(local_3f8._M_head_impl)->_vptr_XCKernelImpl[0x11])
                (local_3f8._M_head_impl,(ulong)pcVar11 & 0xffffffff,
                 local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (*(local_3f0._M_head_impl)->_vptr_XCKernelImpl[0x11])
                (local_3f0._M_head_impl,(ulong)pcVar11 & 0xffffffff,
                 local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
  }
  else if ((int)local_360 == 1) {
    (*(local_3f8._M_head_impl)->_vptr_XCKernelImpl[0xe])
              (local_3f8._M_head_impl,(ulong)pcVar11 & 0xffffffff,
               local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    (*(local_3f0._M_head_impl)->_vptr_XCKernelImpl[0xe])
              (local_3f0._M_head_impl,(ulong)pcVar11 & 0xffffffff,
               local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  else if ((int)local_360 == 0) {
    (*(local_3f8._M_head_impl)->_vptr_XCKernelImpl[0xd])
              (local_3f8._M_head_impl,(ulong)pcVar11 & 0xffffffff,
               local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    (*(local_3f0._M_head_impl)->_vptr_XCKernelImpl[0xd])
              (local_3f0._M_head_impl,(ulong)pcVar11 & 0xffffffff,
               local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if ((int)pcVar11 != 0) {
    pcVar11 = (pointer)0x0;
    do {
      local_358._vptr_ITransientExpression = (_func_int **)0x103d1b0;
      local_358.m_isBinaryExpression = true;
      local_358.m_result = true;
      local_358._10_6_ = 0;
      macroName_02.m_size = 4;
      macroName_02.m_start = "INFO";
      Catch::MessageBuilder::MessageBuilder
                (&local_3d0,macroName_02,(SourceLineInfo *)&local_358,Info);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_3d0.super_MessageStream.m_stream.m_oss,"EXC Fails: Kernel is ",0x15);
      ExchCXX::operator<<(local_3d0.super_MessageStream.m_stream.m_oss,local_3e4);
      Catch::ScopedMessage::ScopedMessage((ScopedMessage *)local_1c0,&local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0.m_info.message._M_dataplus._M_p != &local_3d0.m_info.message.field_2) {
        operator_delete(local_3d0.m_info.message._M_dataplus._M_p,
                        local_3d0.m_info.message.field_2._M_allocated_capacity + 1);
      }
      Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_3d0);
      local_358._vptr_ITransientExpression = (_func_int **)0x103d1b0;
      local_358.m_isBinaryExpression = true;
      local_358.m_result = true;
      local_358._10_6_ = 0;
      macroName_03.m_size = 5;
      macroName_03.m_start = "CHECK";
      capturedExpression_02.m_size = 0x26;
      capturedExpression_02.m_start = "exc_builtin[i] == Approx(exc_libxc[i])";
      Catch::AssertionHandler::AssertionHandler
                ((AssertionHandler *)&local_3d0,macroName_03,(SourceLineInfo *)&local_358,
                 capturedExpression_02,ContinueOnFailure);
      local_3d8 = local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)pcVar11];
      Catch::Approx::Approx
                (&local_50,
                 local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)pcVar11]);
      bVar2 = Catch::Approx::equalityComparisonImpl(&local_50,local_3d8);
      local_358.m_result = bVar2;
      local_358.m_isBinaryExpression = true;
      local_358._vptr_ITransientExpression =
           (_func_int **)&PTR_streamReconstructedExpression_01114740;
      local_348 = local_3d8;
      local_340 = "==";
      local_338 = 2;
      local_330 = &local_50;
      Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_3d0,&local_358);
      Catch::AssertionHandler::complete((AssertionHandler *)&local_3d0);
      if (local_3d0.m_info.message.field_2._M_local_buf[0xb] == '\0') {
        (**(code **)(*(long *)local_3d0.m_info.lineInfo.file + 0xa0))
                  (local_3d0.m_info.lineInfo.file,&local_3d0);
      }
      Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)local_1c0);
      pcVar11 = pcVar11 + 1;
    } while (local_3e0 != pcVar11);
  }
  if ((int)local_360 == 1) {
    (*(local_3f8._M_head_impl)->_vptr_XCKernelImpl[7])();
    if ((int)local_3e0 != 0) {
      uVar9 = 0;
      do {
        local_358._vptr_ITransientExpression = (_func_int **)0x103d1b0;
        local_358.m_isBinaryExpression = true;
        local_358.m_result = true;
        local_358._10_6_ = 0;
        macroName_04.m_size = 4;
        macroName_04.m_start = "INFO";
        Catch::MessageBuilder::MessageBuilder
                  (&local_3d0,macroName_04,(SourceLineInfo *)&local_358,Info);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_3d0.super_MessageStream.m_stream.m_oss,"VRHO Fails: Kernel is ",0x16);
        ExchCXX::operator<<(local_3d0.super_MessageStream.m_stream.m_oss,local_3e4);
        Catch::ScopedMessage::ScopedMessage((ScopedMessage *)local_1c0,&local_3d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0.m_info.message._M_dataplus._M_p != &local_3d0.m_info.message.field_2) {
          operator_delete(local_3d0.m_info.message._M_dataplus._M_p,
                          local_3d0.m_info.message.field_2._M_allocated_capacity + 1);
        }
        Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_3d0);
        local_358._vptr_ITransientExpression = (_func_int **)0x103d1b0;
        local_358.m_isBinaryExpression = true;
        local_358.m_result = true;
        local_358._10_6_ = 0;
        macroName_05.m_size = 5;
        macroName_05.m_start = "CHECK";
        capturedExpression_03.m_size = 0x28;
        capturedExpression_03.m_start = "vrho_builtin[i] == Approx(vrho_libxc[i])";
        Catch::AssertionHandler::AssertionHandler
                  ((AssertionHandler *)&local_3d0,macroName_05,(SourceLineInfo *)&local_358,
                   capturedExpression_03,ContinueOnFailure);
        local_3d8 = local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar9];
        Catch::Approx::Approx
                  (&local_50,
                   local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9]);
        bVar2 = Catch::Approx::equalityComparisonImpl(&local_50,local_3d8);
        local_358.m_result = bVar2;
        local_358.m_isBinaryExpression = true;
        local_358._vptr_ITransientExpression =
             (_func_int **)&PTR_streamReconstructedExpression_01114740;
        local_348 = local_3d8;
        local_340 = "==";
        local_338 = 2;
        local_330 = &local_50;
        Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_3d0,&local_358);
        Catch::AssertionHandler::complete((AssertionHandler *)&local_3d0);
        if (local_3d0.m_info.message.field_2._M_local_buf[0xb] == '\0') {
          (**(code **)(*(long *)local_3d0.m_info.lineInfo.file + 0xa0))
                    (local_3d0.m_info.lineInfo.file,&local_3d0);
        }
        Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)local_1c0);
        uVar9 = uVar9 + 1;
        iVar6 = (*(local_3f8._M_head_impl)->_vptr_XCKernelImpl[7])();
      } while (uVar9 < (ulong)((long)local_3e0 << ((byte)iVar6 & 0x3f)));
    }
    local_360 = (pointer)((long)local_3e0 * 3);
    pcVar11 = (pointer)0x0;
    while( true ) {
      _Var1._M_head_impl = local_3f8._M_head_impl;
      iVar6 = (*(local_3f8._M_head_impl)->_vptr_XCKernelImpl[3])(local_3f8._M_head_impl);
      if ((char)iVar6 == '\0') {
        iVar6 = (*(_Var1._M_head_impl)->_vptr_XCKernelImpl[7])(_Var1._M_head_impl);
        pcVar7 = local_3e0;
        if ((char)iVar6 != '\0') {
          pcVar7 = local_360;
        }
      }
      else {
        pcVar7 = (pointer)0x0;
      }
      if (pcVar7 <= pcVar11) break;
      local_358._vptr_ITransientExpression = (_func_int **)0x103d1b0;
      local_358.m_isBinaryExpression = true;
      local_358.m_result = true;
      local_358._10_6_ = 0;
      macroName_06.m_size = 4;
      macroName_06.m_start = "INFO";
      Catch::MessageBuilder::MessageBuilder
                (&local_3d0,macroName_06,(SourceLineInfo *)&local_358,Info);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_3d0.super_MessageStream.m_stream.m_oss,"VSIGMA Fails: Kernel is ",0x18);
      ExchCXX::operator<<(local_3d0.super_MessageStream.m_stream.m_oss,local_3e4);
      Catch::ScopedMessage::ScopedMessage((ScopedMessage *)local_1c0,&local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0.m_info.message._M_dataplus._M_p != &local_3d0.m_info.message.field_2) {
        operator_delete(local_3d0.m_info.message._M_dataplus._M_p,
                        local_3d0.m_info.message.field_2._M_allocated_capacity + 1);
      }
      Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_3d0);
      local_358._vptr_ITransientExpression = (_func_int **)0x103d1b0;
      local_358.m_isBinaryExpression = true;
      local_358.m_result = true;
      local_358._10_6_ = 0;
      macroName_07.m_size = 5;
      macroName_07.m_start = "CHECK";
      capturedExpression_04.m_size = 0x2c;
      capturedExpression_04.m_start = "vsigma_builtin[i] == Approx(vsigma_libxc[i])";
      Catch::AssertionHandler::AssertionHandler
                ((AssertionHandler *)&local_3d0,macroName_07,(SourceLineInfo *)&local_358,
                 capturedExpression_04,ContinueOnFailure);
      local_3d8 = local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)pcVar11];
      Catch::Approx::Approx
                (&local_50,
                 local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)pcVar11]);
      bVar2 = Catch::Approx::equalityComparisonImpl(&local_50,local_3d8);
      local_358.m_result = bVar2;
      local_358.m_isBinaryExpression = true;
      local_358._vptr_ITransientExpression =
           (_func_int **)&PTR_streamReconstructedExpression_01114740;
      local_348 = local_3d8;
      local_340 = "==";
      local_338 = 2;
      local_330 = &local_50;
      Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_3d0,&local_358);
      Catch::AssertionHandler::complete((AssertionHandler *)&local_3d0);
      if (local_3d0.m_info.message.field_2._M_local_buf[0xb] == '\0') {
        (**(code **)(*(long *)local_3d0.m_info.lineInfo.file + 0xa0))
                  (local_3d0.m_info.lineInfo.file,&local_3d0);
      }
      Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)local_1c0);
      pcVar11 = pcVar11 + 1;
    }
  }
  if (local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ExchCXX::XCKernel::~XCKernel((XCKernel *)&local_3f0);
  ExchCXX::XCKernel::~XCKernel((XCKernel *)&local_3f8);
  if (local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void compare_libxc_builtin( TestInterface interface, EvalType evaltype,
  Kernel kern, Spin polar ) {

  size_t npts_lda, npts_gga, npts_mgga, npts_lapl;
  std::vector<double> ref_rho, ref_sigma, ref_lapl, ref_tau;
  std::tie(npts_lda, ref_rho  )  = load_reference_density( polar );
  std::tie(npts_gga, ref_sigma)  = load_reference_sigma  ( polar );
  std::tie(npts_lapl, ref_lapl)  = load_reference_lapl   ( polar );
  std::tie(npts_mgga, ref_tau)   = load_reference_tau    ( polar );

  REQUIRE( npts_lda == npts_gga );
  REQUIRE( npts_lda == npts_mgga );
  REQUIRE( npts_lda == npts_lapl );

  const int npts = npts_lda;

  XCKernel func_libxc  ( Backend::libxc,   kern, polar );
  XCKernel func_builtin( Backend::builtin, kern, polar );


  const int len_rho   = func_libxc.rho_buffer_len( npts );
  const int len_sigma = func_libxc.sigma_buffer_len( npts );
  const int len_lapl = func_libxc.lapl_buffer_len( npts );
  const int len_tau = func_libxc.tau_buffer_len( npts );

  std::vector<double> rho_small(len_rho, 1e-13);
  std::vector<double> sigma_small(len_sigma, 1e-14);
  std::vector<double> lapl_small(len_lapl, 1e-14);
  std::vector<double> tau_small(len_tau, 1e-14);

  std::vector<double> rho_zero(len_rho, 0.);
  std::vector<double> sigma_zero(len_sigma, 0.);
  std::vector<double> lapl_zero(len_lapl, 0.);
  std::vector<double> tau_zero(len_tau, 0.);

  std::vector<double> rho_use, sigma_use, lapl_use, tau_use;

  if( evaltype == EvalType::Regular ) {
    rho_use   = ref_rho;
    sigma_use = ref_sigma;
    lapl_use = ref_lapl;
    tau_use = ref_tau;
  }

  if( evaltype == EvalType::Small ) {
    rho_use   = rho_small;
    sigma_use = sigma_small;
    lapl_use = lapl_small;
    tau_use = tau_small;
  }

  if( evaltype == EvalType::Zero ) {
    rho_use   = rho_zero;
    sigma_use = sigma_zero;
    lapl_use = lapl_zero;
    tau_use = tau_zero;
  }



  std::vector<double> exc_libxc( func_builtin.exc_buffer_len(npts) );
  std::vector<double> vrho_libxc( func_builtin.vrho_buffer_len(npts) );
  std::vector<double> vsigma_libxc( func_builtin.vsigma_buffer_len(npts) );
  std::vector<double> vlapl_libxc( func_builtin.vlapl_buffer_len(npts) );
  std::vector<double> vtau_libxc( func_builtin.vtau_buffer_len(npts) );

  std::vector<double> exc_builtin( func_builtin.exc_buffer_len(npts) );
  std::vector<double> vrho_builtin( func_builtin.vrho_buffer_len(npts) );
  std::vector<double> vsigma_builtin( func_builtin.vsigma_buffer_len(npts) );
  std::vector<double> vlapl_builtin( func_builtin.vlapl_buffer_len(npts) );
  std::vector<double> vtau_builtin( func_builtin.vtau_buffer_len(npts) );

  if( func_libxc.is_lda() ) {

    if( interface == TestInterface::EXC ) {

      func_libxc.eval_exc( npts, rho_use.data(), exc_libxc.data() );
      func_builtin.eval_exc( npts, rho_use.data(), exc_builtin.data() );

    } else if( interface == TestInterface::EXC_VXC ) {

      func_libxc.eval_exc_vxc( npts, rho_use.data(), exc_libxc.data(),
        vrho_libxc.data() );
      func_builtin.eval_exc_vxc( npts, rho_use.data(), exc_builtin.data(),
        vrho_builtin.data() );

    }

  } else if( func_libxc.is_gga() ) {

    if( interface == TestInterface::EXC ) {

      func_libxc.eval_exc( npts, rho_use.data(), sigma_use.data(),
        exc_libxc.data() );
      func_builtin.eval_exc( npts, rho_use.data(), sigma_use.data(),
        exc_builtin.data() );

    } else if( interface == TestInterface::EXC_VXC ) {

      func_libxc.eval_exc_vxc( npts, rho_use.data(), sigma_use.data(),
        exc_libxc.data(), vrho_libxc.data(), vsigma_libxc.data() );
      func_builtin.eval_exc_vxc( npts, rho_use.data(), sigma_use.data(),
        exc_builtin.data(), vrho_builtin.data(), vsigma_builtin.data() );

    }

  } else if( func_libxc.is_mgga() ) {

    if( interface == TestInterface::EXC ) {

      func_libxc.eval_exc( npts, rho_use.data(), sigma_use.data(),
        lapl_use.data(), tau_use.data(), exc_libxc.data() );
      func_builtin.eval_exc( npts, rho_use.data(), sigma_use.data(),
        lapl_use.data(), tau_use.data(), exc_builtin.data() );

    } else if( interface == TestInterface::EXC_VXC ) {

      func_libxc.eval_exc_vxc( npts, rho_use.data(), sigma_use.data(),
        lapl_use.data(), tau_use.data(), exc_libxc.data(), vrho_libxc.data(), vsigma_libxc.data(), vlapl_libxc.data(), vtau_libxc.data() );
      func_builtin.eval_exc_vxc( npts, rho_use.data(), sigma_use.data(),
        lapl_use.data(), tau_use.data(), exc_builtin.data(), vrho_builtin.data(), vsigma_builtin.data(), vlapl_builtin.data(), vtau_builtin.data() );

    }

  }

  // Check correctness
  for( auto i = 0ul; i < func_libxc.exc_buffer_len(npts); ++i ) {
    INFO( "EXC Fails: Kernel is " << kern );
    CHECK( exc_builtin[i] == Approx(exc_libxc[i]) );
  }

  if( interface == TestInterface::EXC_VXC ) {
    for( auto i = 0ul; i < func_libxc.vrho_buffer_len(npts); ++i ) {
      INFO( "VRHO Fails: Kernel is " << kern );
      CHECK( vrho_builtin[i] == Approx(vrho_libxc[i]) );
    }
    for( auto i = 0ul; i < func_libxc.vsigma_buffer_len(npts); ++i ) {
      INFO( "VSIGMA Fails: Kernel is " << kern );
      CHECK( vsigma_builtin[i] == Approx(vsigma_libxc[i]) );
    }
  }

}